

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool MeCab::toLower(string *s)

{
  byte bVar1;
  pointer pcVar2;
  size_t i;
  
  for (i = 0; i < s->_M_string_length; i = i + 1) {
    pcVar2 = (s->_M_dataplus)._M_p;
    bVar1 = pcVar2[i];
    if ((byte)(bVar1 + 0xbf) < 0x1a) {
      pcVar2[i] = bVar1 | 0x20;
    }
  }
  return true;
}

Assistant:

bool toLower(std::string *s) {
  for (size_t i = 0; i < s->size(); ++i) {
    char c = (*s)[i];
    if ((c >= 'A') && (c <= 'Z')) {
      c += 'a' - 'A';
      (*s)[i] = c;
    }
  }
  return true;
}